

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O2

void __thiscall FrozenCleanupCheck::~FrozenCleanupCheck(FrozenCleanupCheck *this)

{
  long in_FS_OFFSET;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->should_freeze == true) {
    std::unique_lock<std::mutex>::unique_lock(&local_20,&m);
    nFrozen.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    std::condition_variable::notify_one();
    std::condition_variable::wait<FrozenCleanupCheck::~FrozenCleanupCheck()::_lambda()_1_>
              ((condition_variable *)cv,&local_20);
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~FrozenCleanupCheck()
    {
        if (should_freeze) {
            std::unique_lock<std::mutex> l(m);
            nFrozen.store(1, std::memory_order_relaxed);
            cv.notify_one();
            cv.wait(l, []{ return nFrozen.load(std::memory_order_relaxed) == 0;});
        }
    }